

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipWhitespaceAndNewline(AsciiParser *this,bool allow_semicolon)

{
  ulong uVar1;
  int *piVar2;
  byte bVar3;
  uint8_t uVar4;
  StreamReader *pSVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  pSVar5 = this->_sr;
  uVar6 = pSVar5->length_;
  uVar8 = pSVar5->idx_;
  if (uVar8 < uVar6) {
    puVar7 = pSVar5->binary_;
    do {
      if (puVar7[uVar8] == '\0') {
        return true;
      }
      uVar1 = uVar8 + 1;
      bVar3 = puVar7[uVar8];
      pSVar5->idx_ = uVar1;
      if ((((ulong)bVar3 < 0x21) && ((0x100001200U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
         (bVar3 == 0x3b && allow_semicolon)) {
        piVar2 = &(this->_curr_cursor).col;
        *piVar2 = *piVar2 + 1;
        uVar8 = uVar1;
      }
      else {
        uVar9 = uVar1;
        if (bVar3 == 0xd) {
          if (uVar1 < uVar6 - 1) {
            uVar9 = uVar8 + 2;
            uVar4 = puVar7[uVar8 + 1];
            pSVar5->idx_ = uVar9;
            if (uVar4 != '\n') {
              if ((long)uVar9 < 1) {
                return false;
              }
              if (pSVar5->length_ <= uVar8) {
                return false;
              }
              pSVar5->idx_ = uVar1;
              uVar9 = uVar1;
            }
          }
        }
        else if (bVar3 != 10) {
          if (0x7ffffffffffffffe < uVar8) {
            return false;
          }
          if (uVar8 <= pSVar5->length_) {
            pSVar5->idx_ = uVar8;
            return true;
          }
          return false;
        }
        (this->_curr_cursor).col = 0;
        (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
        uVar8 = uVar9;
      }
    } while (uVar8 < uVar6);
  }
  return true;
}

Assistant:

bool AsciiParser::SkipWhitespaceAndNewline(const bool allow_semicolon) {
  // USDA also allow C-style ';' as a newline separator.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}